

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::update<QRect>(QWidgetPrivate *this,QRect r)

{
  long lVar1;
  bool bVar2;
  QWidget *this_00;
  QEvent *pQVar3;
  QTLWExtra *pQVar4;
  QWidgetRepaintManager *in_RSI;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  QTLWExtra *tlwExtra;
  QWidget *q;
  QRect clipped;
  QRegion *in_stack_ffffffffffffff88;
  QWidgetPrivate *in_stack_ffffffffffffff90;
  QWidget *in_stack_ffffffffffffff98;
  QWidget *in_stack_ffffffffffffffa8;
  QRegion local_40;
  undefined1 local_38 [8];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(in_RDI);
  if (((*(uint *)&in_RDI->field_0x250 >> 0x18 & 1) == 0) ||
     (bVar2 = QWidget::isVisible((QWidget *)0x38bcfc), bVar2)) {
    bVar2 = QWidget::isVisible((QWidget *)0x38bd2c);
    if ((bVar2) && (bVar2 = QWidget::updatesEnabled((QWidget *)0x38bd3c), bVar2)) {
      _local_38 = QWidget::rect(in_stack_ffffffffffffffa8);
      auVar5 = QRect::operator&((QRect *)&stack0xffffffffffffffe8,(QRect *)local_38);
      bVar2 = QRect::isEmpty((QRect *)in_stack_ffffffffffffff90);
      if (!bVar2) {
        bVar2 = QWidget::testAttribute
                          (in_stack_ffffffffffffff98,
                           (WidgetAttribute)((ulong)in_stack_ffffffffffffff90 >> 0x20));
        if (bVar2) {
          pQVar3 = (QEvent *)operator_new(0x18);
          QRegion::QRegion(&local_40,(QRect *)&stack0xffffffffffffffd8,Rectangle);
          QUpdateLaterEvent::QUpdateLaterEvent
                    ((QUpdateLaterEvent *)this_00,in_stack_ffffffffffffff88);
          QCoreApplication::postEvent(&this_00->super_QObject,pQVar3,0);
          QRegion::~QRegion(&local_40);
        }
        else {
          QWidget::window((QWidget *)in_RDI);
          QWidget::d_func((QWidget *)0x38be1c);
          pQVar4 = maybeTopData(in_stack_ffffffffffffff90);
          if (((pQVar4 != (QTLWExtra *)0x0) && (pQVar4->backingStore != (QBackingStore *)0x0)) &&
             (bVar2 = std::unique_ptr::operator_cast_to_bool
                                ((unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>
                                  *)0x38be4b), bVar2)) {
            std::unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>::
            operator->((unique_ptr<QWidgetRepaintManager,_std::default_delete<QWidgetRepaintManager>_>
                        *)0x38be5f);
            QWidgetRepaintManager::markDirty<QRect>
                      (in_RSI,auVar5._8_8_,auVar5._0_8_,local_38._12_4_,local_38._8_4_);
          }
        }
      }
    }
  }
  else {
    *(uint *)&in_RDI->field_0x250 = *(uint *)&in_RDI->field_0x250 & 0xf7ffffff | 0x8000000;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::update(T r)
{
    Q_Q(QWidget);

    if (renderToTexture && !q->isVisible()) {
        renderToTextureReallyDirty = 1;
        return;
    }

    if (!q->isVisible() || !q->updatesEnabled())
        return;

    T clipped = r & q->rect();

    if (clipped.isEmpty())
        return;

    if (q->testAttribute(Qt::WA_WState_InPaintEvent)) {
        QCoreApplication::postEvent(q, new QUpdateLaterEvent(clipped));
        return;
    }

    QTLWExtra *tlwExtra = q->window()->d_func()->maybeTopData();
    if (tlwExtra && tlwExtra->backingStore && tlwExtra->repaintManager)
        tlwExtra->repaintManager->markDirty(clipped, q);
}